

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_impl.h
# Opt level: O0

char * google::protobuf::internal::TcParser::
       GenericFallbackImpl<google::protobuf::MessageLite,std::__cxx11::string>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint32_t tag_00;
  uint *puVar1;
  ExtensionSet *this;
  MessageLite *extendee;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint32_t tag;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  uint32_t has_bits_offset;
  
  if (ptr == (char *)0x0) {
    data_local.field_0 =
         (anon_union_8_1_898a9ca8_for_TcFieldData_0)
         &GenericFallbackImpl<google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::kOps;
  }
  else {
    msg_local = (MessageLite *)data.field_0;
    if (table->has_bits_offset != 0) {
      puVar1 = RefAt<unsigned_int>(msg,(ulong)(uint)table->has_bits_offset);
      *puVar1 = (uint)hasbits | *puVar1;
    }
    tag_00 = TcFieldData::tag((TcFieldData *)&msg_local);
    if (((tag_00 & 7) == 4) || (tag_00 == 0)) {
      EpsCopyInputStream::SetLastTag(&ctx->super_EpsCopyInputStream,tag_00);
      data_local.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr;
    }
    else if (table->extension_offset == 0) {
      unknown = InternalMetadata::mutable_unknown_fields<std::__cxx11::string>
                          (&msg->_internal_metadata_);
      data_local.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)UnknownFieldParse(tag_00,unknown,ptr,ctx);
    }
    else {
      this = RefAt<google::protobuf::internal::ExtensionSet>(msg,(ulong)table->extension_offset);
      extendee = TcParseTableBase::default_instance(table);
      data_local.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           ExtensionSet::ParseField(this,(ulong)tag_00,ptr,extendee,&msg->_internal_metadata_,ctx);
    }
  }
  return (char *)data_local.field_0.data;
}

Assistant:

PROTOBUF_CC static const char* GenericFallbackImpl(PROTOBUF_TC_PARAM_DECL) {
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
      // This is the ABI used by GetUnknownFieldOps(). Return the vtable.
      static constexpr UnknownFieldOps kOps = {
          WriteVarintToUnknown<UnknownFieldsT>,
          WriteLengthDelimitedToUnknown<UnknownFieldsT>};
      return reinterpret_cast<const char*>(&kOps);
    }

    SyncHasbits(msg, hasbits, table);
    uint32_t tag = data.tag();
    if ((tag & 7) == WireFormatLite::WIRETYPE_END_GROUP || tag == 0) {
      ctx->SetLastTag(tag);
      return ptr;
    }

    if (table->extension_offset != 0) {
      // We don't need to check the extension ranges. If it is not an extension
      // it will be handled just like if it was an unknown extension: sent to
      // the unknown field set.
      return RefAt<ExtensionSet>(msg, table->extension_offset)
          .ParseField(
              tag, ptr,
              static_cast<const MessageBaseT*>(table->default_instance()),
              &msg->_internal_metadata_, ctx);
    } else {
      // Otherwise, we directly put it on the unknown field set.
      return UnknownFieldParse(
          tag,
          msg->_internal_metadata_.mutable_unknown_fields<UnknownFieldsT>(),
          ptr, ctx);
    }
  }